

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsystem.c
# Opt level: O2

int xglx_get_monitor_dpi(int adapter)

{
  undefined8 uVar1;
  _Bool _Var2;
  int iVar3;
  ALLEGRO_SYSTEM_XGLX *s;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ALLEGRO_MONITOR_INFO info;
  ALLEGRO_MONITOR_INFO local_20;
  
  s = (ALLEGRO_SYSTEM_XGLX *)al_get_system_driver();
  _Var2 = _al_xglx_get_monitor_info(s,adapter,&local_20);
  iVar3 = 0;
  if (_Var2) {
    auVar5._0_8_ = (double)(local_20.x2 - local_20.x1);
    auVar5._8_8_ = (double)(local_20.y2 - local_20.y1);
    uVar1 = *(undefined8 *)
             (*(long *)(s->x11display + 0xe8) + 0x20 + (long)*(int *)(s->x11display + 0xe0) * 0x80);
    auVar6._0_8_ = (double)(int)uVar1 * 0.03937;
    auVar6._8_8_ = (double)(int)((ulong)uVar1 >> 0x20) * 0.03937;
    auVar5 = divpd(auVar5,auVar6);
    dVar4 = (double)((int)auVar5._8_8_ * (int)auVar5._0_8_);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    iVar3 = (int)dVar4;
  }
  return iVar3;
}

Assistant:

static int xglx_get_monitor_dpi(int adapter)
{
   ALLEGRO_MONITOR_INFO info;
   ALLEGRO_SYSTEM_XGLX *s = (void *)al_get_system_driver();
   int x2_mm;
   int y2_mm;
   int dpi_hori;
   int dpi_vert;

   if(!_al_xglx_get_monitor_info(s, adapter, &info)) {
      return 0;
   }

   x2_mm = DisplayWidthMM(s->x11display, DefaultScreen(s->x11display));
   y2_mm = DisplayHeightMM(s->x11display, DefaultScreen(s->x11display));

   dpi_hori = (info.x2 - info.x1) / (_AL_INCHES_PER_MM * x2_mm);
   dpi_vert = (info.y2 - info.y1) / (_AL_INCHES_PER_MM * y2_mm);

   return sqrt(dpi_hori * dpi_vert);
}